

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-bounding-box.cpp
# Opt level: O1

void __thiscall gepard::BoundingBox::stretch(BoundingBox *this,FloatPoint *p)

{
  double dVar1;
  
  dVar1 = p->x;
  if (dVar1 < this->minX) {
    this->minX = dVar1;
  }
  if (this->maxX <= dVar1 && dVar1 != this->maxX) {
    this->maxX = dVar1;
  }
  dVar1 = p->y;
  if (dVar1 < this->minY) {
    this->minY = dVar1;
  }
  if (this->maxY <= dVar1 && dVar1 != this->maxY) {
    this->maxY = dVar1;
  }
  return;
}

Assistant:

void BoundingBox::stretch(const FloatPoint& p)
{
    stretchX(p.x);
    stretchY(p.y);
}